

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test::Body
          (iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  longdouble *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1f1;
  AssertionResult local_1f0;
  longdouble local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  char *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [392];
  
  local_1c8 = (longdouble)1;
  local_198._0_10_ = local_1c8;
  iutest::internal::CmpHelperEQ<long_double,long_double>
            (&local_1f0,(internal *)0x327b1d,"x",(char *)&local_1c8,(longdouble *)local_198,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
    local_1a0._0_4_ = 0x14a;
    local_1a0._4_4_ = 2;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != &local_1b8) {
      operator_delete(local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p == &local_1f0.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_1f0.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0.m_message._M_dataplus._M_p,
                      local_1f0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1c8 = (longdouble)1;
    local_198._0_10_ = local_1c8;
    iutest::internal::CmpHelperEQ<long_double,long_double>
              (&local_1f0,(internal *)0x327b1d,"x",(char *)&local_1c8,(longdouble *)local_198,in_R9)
    ;
    if (local_1f0.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
      local_1a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
      local_1a0._0_4_ = 0x14c;
      local_1a0._4_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete(local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0.m_message._M_dataplus._M_p,
                      local_1f0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1c8 = (longdouble)1;
    local_198._0_10_ = local_1c8;
    iutest::internal::CmpHelperEQ<long_double,long_double>
              (&local_1f0,(internal *)0x327b1d,"x",(char *)&local_1c8,(longdouble *)local_198,in_R9)
    ;
    if (local_1f0.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
      local_1a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
      local_1a0._0_4_ = 0x14e;
      local_1a0._4_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete(local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0.m_message._M_dataplus._M_p,
                      local_1f0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1c8 = (longdouble)1;
    local_198._0_10_ = local_1c8;
    iutest::internal::CmpHelperEQ<long_double,long_double>
              (&local_1f0,(internal *)0x327b1d,"x",(char *)&local_1c8,(longdouble *)local_198,in_R9)
    ;
    if (local_1f0.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
      local_1a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
      local_1a0._0_4_ = 0x150;
      local_1a0._4_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete(local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_1f0.m_message._M_dataplus._M_p,
                  local_1f0.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, AlmostLongDoubleEq)
{
    if( long double x = 1.0l )
        IUTEST_ASSERT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        IUTEST_EXPECT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        IUTEST_INFORM_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        IUTEST_ASSUME_ALMOST_EQ(1.0l, x);
}